

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O2

int Abc_NtkRenodeEvalMv(If_Man_t *p,If_Cut_t *pCut)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  
  bVar1 = pCut->field_0x1f;
  for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined1 *)((long)&pCut[1].Area + uVar6 + (ulong)bVar1 * 4) = 1;
  }
  puVar4 = If_CutTruth(p,pCut);
  uVar2 = Kit_TruthIsop(puVar4,(uint)(byte)pCut->field_0x1f,s_vMemory,0);
  if (uVar2 != 0xffffffff) {
    if (1 < uVar2) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,299,"int Abc_NtkRenodeEvalMv(If_Man_t *, If_Cut_t *)");
    }
    puVar4 = If_CutTruth(p,pCut);
    puVar5 = If_CutTruth(p,pCut);
    Kit_TruthNot(puVar4,puVar5,(uint)(byte)pCut->field_0x1f);
    puVar4 = If_CutTruth(p,pCut);
    uVar2 = Kit_TruthIsop(puVar4,(uint)(byte)pCut->field_0x1f,s_vMemory2,0);
    puVar4 = If_CutTruth(p,pCut);
    puVar5 = If_CutTruth(p,pCut);
    Kit_TruthNot(puVar4,puVar5,(uint)(byte)pCut->field_0x1f);
    if (uVar2 != 0xffffffff) {
      if (1 < uVar2) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                      ,0x132,"int Abc_NtkRenodeEvalMv(If_Man_t *, If_Cut_t *)");
      }
      iVar3 = Abc_NodeEvalMvCost((uint)(byte)pCut->field_0x1f,s_vMemory,s_vMemory2);
      if (iVar3 < 0xfff) {
        return iVar3;
      }
      return 0xfff;
    }
  }
  return 0xfff;
}

Assistant:

int Abc_NtkRenodeEvalMv( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue;
    // set internal mapper parameters
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    // compute ISOP for the positive phase
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 0 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    // compute ISOP for the negative phase
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory2, 0 );
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    // return the cost of the cut 
    RetValue = Abc_NodeEvalMvCost( If_CutLeaveNum(pCut), s_vMemory, s_vMemory2 );
    if ( RetValue >= IF_COST_MAX )
        return IF_COST_MAX;
    return RetValue;
}